

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::mousePressEventHandler
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QGraphicsScene *this_00;
  QGraphicsItem **ppQVar1;
  QGraphicsItem *this_01;
  QGraphicsItem **ppQVar2;
  bool bVar3;
  bool bVar4;
  GraphicsItemFlags GVar5;
  FocusPolicy FVar6;
  PanelModality PVar7;
  MouseButtons MVar8;
  MouseButton MVar9;
  MouseButton MVar10;
  DragMode DVar11;
  KeyboardModifiers KVar12;
  QGraphicsScenePrivate *d;
  QWidget *pQVar13;
  QGraphicsWidget *widget;
  QGraphicsWidget *pQVar14;
  QGraphicsView *this_02;
  long lVar15;
  long lVar16;
  long lVar17;
  long in_FS_OFFSET;
  bool itemIsDying;
  QPointF QVar18;
  QGraphicsItem *item;
  QPointF local_70;
  QGraphicsItem *topItem;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScene **)&this->field_0x8;
  (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 0;
  lVar17 = (this->mouseGrabberItems).d.size;
  if (lVar17 == 0) {
    if ((this->cachedItemsUnderMouse).d.size == 0) {
      topItem = (QGraphicsItem *)QGraphicsSceneMouseEvent::screenPos(mouseEvent);
      QVar18 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
      local_70.yp = QVar18.yp;
      local_70.xp = QVar18.xp;
      pQVar13 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
      itemsAtPosition((QList<QGraphicsItem_*> *)&local_58,this,(QPoint *)&topItem,&local_70,pQVar13)
      ;
      QArrayDataPointer<QGraphicsItem_*>::operator=(&(this->cachedItemsUnderMouse).d,&local_58);
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
      if ((this->cachedItemsUnderMouse).d.size != 0) goto LAB_00595b7b;
      topItem = (QGraphicsItem *)0x0;
LAB_00595bcb:
      widget = (QGraphicsWidget *)0x0;
    }
    else {
LAB_00595b7b:
      topItem = *(this->cachedItemsUnderMouse).d.ptr;
      if ((topItem == (QGraphicsItem *)0x0) ||
         (widget = QGraphicsItem::window(topItem), widget == (QGraphicsWidget *)0x0))
      goto LAB_00595bcb;
      bVar3 = QGraphicsItem::isBlockedByModalPanel
                        (&(widget->super_QGraphicsObject).super_QGraphicsItem,&topItem);
      if (bVar3) {
        if (topItem == (QGraphicsItem *)0x0) goto LAB_00595bcb;
        widget = QGraphicsItem::window(topItem);
      }
    }
    pQVar14 = QGraphicsScene::activeWindow(this_00);
    if (widget != pQVar14) {
      QGraphicsScene::setActiveWindow(this_00,widget);
    }
    ppQVar1 = (this->cachedItemsUnderMouse).d.ptr;
    lVar17 = (this->cachedItemsUnderMouse).d.size;
    lVar16 = 0;
    while (lVar17 << 3 != lVar16) {
      this_01 = *(QGraphicsItem **)((long)ppQVar1 + lVar16);
      bVar4 = QGraphicsItem::isBlockedByModalPanel(this_01,(QGraphicsItem **)0x0);
      bVar3 = true;
      if ((bVar4) || ((((this_01->d_ptr).d)->field_0x166 & 4) != 0)) goto LAB_00595c91;
      bVar4 = QGraphicsItem::isEnabled(this_01);
      if (((bVar4) &&
          (GVar5 = QGraphicsItem::flags(this_01),
          ((uint)GVar5.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                 super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) != 0)) &&
         ((bVar4 = QGraphicsItem::isWidget(this_01), !bVar4 ||
          (FVar6 = QGraphicsWidget::focusPolicy((QGraphicsWidget *)(this_01 + -1)),
          (FVar6 & ClickFocus) != NoFocus)))) {
        if ((this_01 !=
             *(QGraphicsItem **)
              (*(long *)(this_00 + 8) + 0x188 +
              (ulong)(*(int *)(*(long *)(this_00 + 8) + 0x1b8) < 1) * 0x10)) &&
           ((((this_01->d_ptr).d)->field_0x168 & 2) != 0)) {
          QGraphicsItem::setFocus(this_01,MouseFocusReason);
        }
        goto LAB_00595c91;
      }
      bVar3 = QGraphicsItem::isPanel(this_01);
      if ((bVar3) || (lVar16 = lVar16 + 8, (((this_01->d_ptr).d)->field_0x166 & 2) != 0)) break;
    }
    bVar3 = false;
LAB_00595c91:
    ppQVar1 = (this->modalPanels).d.ptr;
    lVar16 = (this->modalPanels).d.size << 3;
    lVar17 = 0;
    do {
      lVar15 = lVar17;
      if (lVar16 == lVar15) break;
      PVar7 = QGraphicsItem::panelModality(*(QGraphicsItem **)((long)ppQVar1 + lVar15));
      lVar17 = lVar15 + 8;
    } while (PVar7 != SceneModal);
    if ((lVar16 == lVar15) && (!bVar3 && (this->field_0xb9 & 2) == 0)) {
      QGraphicsScene::setFocusItem(this_00,(QGraphicsItem *)0x0,MouseFocusReason);
    }
    lVar17 = (this->cachedItemsUnderMouse).d.size;
    if ((lVar16 != lVar15) && (lVar17 == 0)) {
      QList<QGraphicsItem_*>::append(&this->cachedItemsUnderMouse,*(this->modalPanels).d.ptr);
      lVar17 = (this->cachedItemsUnderMouse).d.size;
    }
    ppQVar1 = (this->cachedItemsUnderMouse).d.ptr;
    for (lVar16 = 0; lVar17 << 3 != lVar16; lVar16 = lVar16 + 8) {
      item = *(QGraphicsItem **)((long)ppQVar1 + lVar16);
      MVar8 = QGraphicsItem::acceptedMouseButtons(item);
      MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
      if ((MVar9 & (uint)MVar8.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                         super_QFlagsStorage<Qt::MouseButton>.i) != NoButton) {
        QGraphicsItem::isBlockedByModalPanel(item,&item);
        grabMouse(this,item,true);
        (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 1;
        bVar3 = QGraphicsItem::isEnabled(item);
        bVar4 = QGraphicsItem::isPanel(item);
        if ((*(short *)&(mouseEvent->super_QGraphicsSceneEvent).field_0x8 == 0x9e) &&
           (this->lastMouseGrabberItem != (QGraphicsItem *)0x0 && item != this->lastMouseGrabberItem
           )) {
          local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
          QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
                    ((QGraphicsSceneMouseEvent *)&local_58,GraphicsSceneMousePress);
          ppQVar2 = local_58.ptr;
          local_58.ptr._5_3_ = SUB83(ppQVar2,5);
          local_58.ptr._0_5_ =
               CONCAT14(1,CONCAT13((mouseEvent->super_QGraphicsSceneEvent).field_0xb,
                                   local_58.ptr._0_3_));
          MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
          QGraphicsSceneMouseEvent::setButton((QGraphicsSceneMouseEvent *)&local_58,MVar9);
          MVar8 = QGraphicsSceneMouseEvent::buttons(mouseEvent);
          QGraphicsSceneMouseEvent::setButtons((QGraphicsSceneMouseEvent *)&local_58,MVar8);
          local_70.xp = (qreal)QGraphicsSceneMouseEvent::screenPos(mouseEvent);
          QGraphicsSceneMouseEvent::setScreenPos
                    ((QGraphicsSceneMouseEvent *)&local_58,(QPoint *)&local_70);
          QVar18 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
          local_70.yp = QVar18.yp;
          local_70.xp = QVar18.xp;
          QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)&local_58,&local_70);
          KVar12 = QGraphicsSceneMouseEvent::modifiers(mouseEvent);
          QGraphicsSceneMouseEvent::setModifiers((QGraphicsSceneMouseEvent *)&local_58,KVar12);
          pQVar13 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
          QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)&local_58,pQVar13);
          MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
          MVar10 = QGraphicsSceneMouseEvent::button(mouseEvent);
          QVar18 = QGraphicsSceneMouseEvent::buttonDownPos(mouseEvent,MVar10);
          local_70.yp = QVar18.yp;
          local_70.xp = QVar18.xp;
          QGraphicsSceneMouseEvent::setButtonDownPos
                    ((QGraphicsSceneMouseEvent *)&local_58,MVar9,&local_70);
          MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
          MVar10 = QGraphicsSceneMouseEvent::button(mouseEvent);
          QVar18 = QGraphicsSceneMouseEvent::buttonDownScenePos(mouseEvent,MVar10);
          local_70.yp = QVar18.yp;
          local_70.xp = QVar18.xp;
          QGraphicsSceneMouseEvent::setButtonDownScenePos
                    ((QGraphicsSceneMouseEvent *)&local_58,MVar9,&local_70);
          MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
          MVar10 = QGraphicsSceneMouseEvent::button(mouseEvent);
          local_70.xp = (qreal)QGraphicsSceneMouseEvent::buttonDownScreenPos(mouseEvent,MVar10);
          QGraphicsSceneMouseEvent::setButtonDownScreenPos
                    ((QGraphicsSceneMouseEvent *)&local_58,MVar9,(QPoint *)&local_70);
          sendMouseEvent(this,(QGraphicsSceneMouseEvent *)&local_58);
          (**(code **)(*(long *)&mouseEvent->super_QGraphicsSceneEvent + 0x10))
                    (mouseEvent,local_58.ptr._4_1_);
          QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_58);
        }
        else {
          sendMouseEvent(this,mouseEvent);
        }
        lVar15 = (this->mouseGrabberItems).d.size;
        if (lVar15 == 0) {
          itemIsDying = true;
        }
        else {
          itemIsDying = (this->mouseGrabberItems).d.ptr[lVar15 + -1] != item;
        }
        if (!bVar3) {
          ungrabMouse(this,item,itemIsDying);
          break;
        }
        if ((mouseEvent->super_QGraphicsSceneEvent).field_0xc == '\x01') {
          if (lVar15 != 0) {
            storeMouseButtonsForMouseGrabber(this,mouseEvent);
          }
          this->lastMouseGrabberItem = item;
          goto LAB_00596041;
        }
        ungrabMouse(this,item,itemIsDying);
        if (bVar4) break;
      }
    }
    if ((mouseEvent->super_QGraphicsSceneEvent).field_0xc == '\0') {
      clearMouseGrabber(this);
      pQVar13 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
      bVar3 = false;
      if (pQVar13 != (QWidget *)0x0) {
        pQVar13 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
        this_02 = (QGraphicsView *)
                  QtPrivate::qobject_cast_helper<QGraphicsView*,QObject>
                            (*(QObject **)(*(long *)&pQVar13->field_0x8 + 0x10));
        if (this_02 != (QGraphicsView *)0x0) {
          DVar11 = QGraphicsView::dragMode(this_02);
          bVar3 = DVar11 == ScrollHandDrag;
        }
      }
      KVar12 = QGraphicsSceneMouseEvent::modifiers(mouseEvent);
      if (((uint)KVar12.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                 super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) == 0 && !bVar3) {
        QGraphicsScene::clearSelection(this_00);
      }
    }
  }
  else {
    bVar3 = QGraphicsItem::isBlockedByModalPanel
                      ((this->mouseGrabberItems).d.ptr[lVar17 + -1],(QGraphicsItem **)0x0);
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sendMouseEvent(this,mouseEvent);
        return;
      }
      goto LAB_005960a6;
    }
  }
LAB_00596041:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005960a6:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::mousePressEventHandler(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_Q(QGraphicsScene);

    // Ignore by default, unless we find a mouse grabber that accepts it.
    mouseEvent->ignore();

    // Deliver to any existing mouse grabber.
    if (!mouseGrabberItems.isEmpty()) {
        if (mouseGrabberItems.constLast()->isBlockedByModalPanel())
            return;
        // The event is ignored by default, but we disregard the event's
        // accepted state after delivery; the mouse is grabbed, after all.
        sendMouseEvent(mouseEvent);
        return;
    }

    // Start by determining the number of items at the current position.
    // Reuse value from earlier calculations if possible.
    if (cachedItemsUnderMouse.isEmpty()) {
        cachedItemsUnderMouse = itemsAtPosition(mouseEvent->screenPos(),
                                                mouseEvent->scenePos(),
                                                mouseEvent->widget());
    }

    // Update window activation.
    QGraphicsItem *topItem = cachedItemsUnderMouse.value(0);
    QGraphicsWidget *newActiveWindow = topItem ? topItem->window() : nullptr;
    if (newActiveWindow && newActiveWindow->isBlockedByModalPanel(&topItem)) {
        // pass activation to the blocking modal window
        newActiveWindow = topItem ? topItem->window() : nullptr;
    }

    if (newActiveWindow != q->activeWindow())
        q->setActiveWindow(newActiveWindow);

    // Set focus on the topmost enabled item that can take focus.
    bool setFocus = false;

    for (QGraphicsItem *item : std::as_const(cachedItemsUnderMouse)) {
        if (item->isBlockedByModalPanel()
            || (item->d_ptr->flags & QGraphicsItem::ItemStopsFocusHandling)) {
            // Make sure we don't clear focus.
            setFocus = true;
            break;
        }
        if (item->isEnabled() && ((item->flags() & QGraphicsItem::ItemIsFocusable))) {
            if (!item->isWidget() || ((QGraphicsWidget *)item)->focusPolicy() & Qt::ClickFocus) {
                setFocus = true;
                if (item != q->focusItem() && item->d_ptr->mouseSetsFocus)
                    q->setFocusItem(item, Qt::MouseFocusReason);
                break;
            }
        }
        if (item->isPanel())
            break;
        if (item->d_ptr->flags & QGraphicsItem::ItemStopsClickFocusPropagation)
            break;
    }

    // Check for scene modality.
    bool sceneModality = false;
    for (auto modalPanel : std::as_const(modalPanels)) {
        if (modalPanel->panelModality() == QGraphicsItem::SceneModal) {
            sceneModality = true;
            break;
        }
    }

    // If nobody could take focus, clear it.
    if (!stickyFocus && !setFocus && !sceneModality)
        q->setFocusItem(nullptr, Qt::MouseFocusReason);

    // Any item will do.
    if (sceneModality && cachedItemsUnderMouse.isEmpty())
        cachedItemsUnderMouse << modalPanels.constFirst();

    // Find a mouse grabber by sending mouse press events to all mouse grabber
    // candidates one at a time, until the event is accepted. It's accepted by
    // default, so the receiver has to explicitly ignore it for it to pass
    // through.
    for (QGraphicsItem *item : std::as_const(cachedItemsUnderMouse)) {
        if (!(item->acceptedMouseButtons() & mouseEvent->button())) {
            // Skip items that don't accept the event's mouse button.
            continue;
        }

        // Check if this item is blocked by a modal panel and deliver the mouse event to the
        // blocking panel instead of this item if blocked.
        (void) item->isBlockedByModalPanel(&item);

        grabMouse(item, /* implicit = */ true);
        mouseEvent->accept();

        // check if the item we are sending to are disabled (before we send the event)
        bool disabled = !item->isEnabled();
        bool isPanel = item->isPanel();
        if (mouseEvent->type() == QEvent::GraphicsSceneMouseDoubleClick
            && item != lastMouseGrabberItem && lastMouseGrabberItem) {
            // If this item is different from the item that received the last
            // mouse event, and mouseEvent is a double-click event, then the
            // event is converted to a press. Known limitation:
            // Triple-clicking will not generate a double-click, though.
            QGraphicsSceneMouseEvent mousePress(QEvent::GraphicsSceneMousePress);
            mousePress.m_spont = mouseEvent->spontaneous();
            mousePress.accept();
            mousePress.setButton(mouseEvent->button());
            mousePress.setButtons(mouseEvent->buttons());
            mousePress.setScreenPos(mouseEvent->screenPos());
            mousePress.setScenePos(mouseEvent->scenePos());
            mousePress.setModifiers(mouseEvent->modifiers());
            mousePress.setWidget(mouseEvent->widget());
            mousePress.setButtonDownPos(mouseEvent->button(),
                                        mouseEvent->buttonDownPos(mouseEvent->button()));
            mousePress.setButtonDownScenePos(mouseEvent->button(),
                                             mouseEvent->buttonDownScenePos(mouseEvent->button()));
            mousePress.setButtonDownScreenPos(mouseEvent->button(),
                                              mouseEvent->buttonDownScreenPos(mouseEvent->button()));
            sendMouseEvent(&mousePress);
            mouseEvent->setAccepted(mousePress.isAccepted());
        } else {
            sendMouseEvent(mouseEvent);
        }

        bool dontSendUngrabEvents = mouseGrabberItems.isEmpty() || mouseGrabberItems.constLast() != item;
        if (disabled) {
            ungrabMouse(item, /* itemIsDying = */ dontSendUngrabEvents);
            break;
        }
        if (mouseEvent->isAccepted()) {
            if (!mouseGrabberItems.isEmpty())
                storeMouseButtonsForMouseGrabber(mouseEvent);
            lastMouseGrabberItem = item;
            return;
        }
        ungrabMouse(item, /* itemIsDying = */ dontSendUngrabEvents);

        // Don't propagate through panels.
        if (isPanel)
            break;
    }

    // Is the event still ignored? Then the mouse press goes to the scene.
    // Reset the mouse grabber, clear the selection, clear focus, and leave
    // the event ignored so that it can propagate through the originating
    // view.
    if (!mouseEvent->isAccepted()) {
        clearMouseGrabber();

        QGraphicsView *view = mouseEvent->widget() ? qobject_cast<QGraphicsView *>(mouseEvent->widget()->parentWidget()) : 0;
        bool dontClearSelection = view && view->dragMode() == QGraphicsView::ScrollHandDrag;
        bool extendSelection = (mouseEvent->modifiers() & Qt::ControlModifier) != 0;
        dontClearSelection |= extendSelection;
        if (!dontClearSelection) {
            // Clear the selection if the originating view isn't in scroll
            // hand drag mode. The view will clear the selection if no drag
            // happened.
            q->clearSelection();
        }
    }
}